

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_syntax.cpp
# Opt level: O1

ParserResult *
parse_positive_command_statement
          (ParserResult *__return_storage_ptr__,ParserContext *parser,token_iterator begin,
          token_iterator end)

{
  bool bVar1;
  anon_class_1_0_00000001 local_21;
  
  parse_oneof<std::pair<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(*)(ParserContext&,TokenStream::TokenData_const*,TokenStream::TokenData_const*),std::pair<TokenStream::TokenData_const*,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(&)(ParserContext&,TokenStream::TokenData_const*,TokenStream::TokenData_const*)>
            (__return_storage_ptr__,parser,begin,end,parse_expression_statement,
             parse_actual_command_statement);
  bVar1 = eggs::variants::detail::
          apply<bool,is<ParserSuccess,eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>>(eggs::variants::variant<ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>const&)::_lambda(auto:1_const&)_1_,eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,ParserSuccess,llvm_vecsmall::SmallVector<ParserError,1u>>,false,false>const&>
                    (&local_21,&(__return_storage_ptr__->second)._storage);
  if (!bVar1) {
    for (; begin != end; begin = begin + 1) {
      if (begin->type == NewLine) {
        end = begin + 1;
        break;
      }
    }
    __return_storage_ptr__->first = end;
  }
  return __return_storage_ptr__;
}

Assistant:

static ParserResult parse_positive_command_statement(ParserContext& parser, token_iterator begin, token_iterator end)
{
    auto result = parse_oneof(parser, begin, end,
                              parse_expression_statement,
                              parse_actual_command_statement);
    if(is<ParserSuccess>(result.second))
        return result;
    else
    {
        result.first = parser_aftertoken(begin, end, Token::NewLine);
        return result;
    }
}